

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__horizontal_gather_3_channels_with_4_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float *pfVar12;
  long lVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  pfVar12 = output_buffer + 3;
  while( true ) {
    lVar13 = (long)horizontal_contributors->n0;
    fVar4 = *horizontal_coefficients;
    fVar5 = horizontal_coefficients[1];
    fVar6 = horizontal_coefficients[2];
    fVar7 = horizontal_coefficients[3];
    pfVar1 = decode_buffer + lVar13 * 3;
    fVar8 = pfVar1[2];
    fVar9 = pfVar1[3];
    pfVar2 = decode_buffer + lVar13 * 3 + 4;
    pfVar3 = decode_buffer + lVar13 * 3 + 8;
    fVar10 = *pfVar3;
    fVar11 = pfVar3[1];
    fVar14 = fVar6 * pfVar2[2] + *pfVar1 * fVar4 + fVar7 * fVar11 + fVar9 * fVar5;
    fVar15 = fVar6 * pfVar2[3] + pfVar1[1] * fVar4 + fVar7 * pfVar3[2] + fVar5 * *pfVar2;
    fVar16 = fVar6 * fVar10 + fVar8 * fVar4 + fVar7 * pfVar3[3] + fVar5 * pfVar2[1];
    if (output_buffer + output_sub_size * 3 <= pfVar12) break;
    horizontal_contributors = horizontal_contributors + 1;
    pfVar12[-3] = fVar14;
    pfVar12[-2] = fVar15;
    pfVar12[-1] = fVar16;
    *pfVar12 = fVar7 * fVar11 + fVar9 * fVar5 + fVar6 * fVar10 + fVar8 * fVar4;
    pfVar12 = pfVar12 + 3;
    horizontal_coefficients = horizontal_coefficients + coefficient_width;
  }
  *(ulong *)(pfVar12 + -3) = CONCAT44(fVar15,fVar14);
  pfVar12[-1] = fVar16;
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_4_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__4_coeff_start();
    stbir__store_output();
  } while ( output < output_end );
}